

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.cc
# Opt level: O2

void __thiscall flow::IRProgram::~IRProgram(IRProgram *this)

{
  vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
  *this_00;
  pointer puVar1;
  bool bVar2;
  long lVar3;
  __normal_iterator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_*,_std::vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>_>
  in_RSI;
  const_iterator cVar4;
  long lVar5;
  pointer __old_p;
  IRHandler *pIVar6;
  _Iter_pred<flow::IRProgram::~IRProgram()::__0> *this_01;
  
  this_00 = &this->handlers_;
  this_01 = (_Iter_pred<flow::IRProgram::~IRProgram()::__0> *)
            (this->handlers_).
            super__Vector_base<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->handlers_).
           super__Vector_base<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)puVar1 - (long)this_01;
  for (lVar3 = lVar5 >> 5;
      cVar4._M_current =
           (unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)this_01, 0 < lVar3;
      lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::_Iter_pred<flow::IRProgram::~IRProgram()::$_0>::operator()
                      (this_01,in_RSI);
    if (bVar2) goto LAB_00140db7;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<flow::IRProgram::~IRProgram()::$_0>::operator()
                      (this_01 + 8,in_RSI);
    cVar4._M_current =
         (unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)(this_01 + 8);
    if (bVar2) goto LAB_00140db7;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<flow::IRProgram::~IRProgram()::$_0>::operator()
                      (this_01 + 0x10,in_RSI);
    cVar4._M_current =
         (unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)(this_01 + 0x10);
    if (bVar2) goto LAB_00140db7;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<flow::IRProgram::~IRProgram()::$_0>::operator()
                      (this_01 + 0x18,in_RSI);
    cVar4._M_current =
         (unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)(this_01 + 0x18);
    if (bVar2) goto LAB_00140db7;
    this_01 = this_01 + 0x20;
    lVar5 = lVar5 + -0x20;
  }
  lVar5 = lVar5 >> 3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      cVar4._M_current = puVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::_Iter_pred<flow::IRProgram::~IRProgram()::$_0>::operator()
                            (this_01,in_RSI),
         cVar4._M_current =
              (unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)this_01, bVar2))
      goto LAB_00140db7;
      cVar4._M_current =
           (unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)(this_01 + 8);
    }
    bVar2 = __gnu_cxx::__ops::_Iter_pred<flow::IRProgram::~IRProgram()::$_0>::operator()
                      ((_Iter_pred<flow::IRProgram::~IRProgram()::__0> *)cVar4._M_current,in_RSI);
    if (bVar2) goto LAB_00140db7;
    this_01 = (_Iter_pred<flow::IRProgram::~IRProgram()::__0> *)((long)cVar4._M_current + 8);
  }
  bVar2 = __gnu_cxx::__ops::_Iter_pred<flow::IRProgram::~IRProgram()::$_0>::operator()
                    (this_01,in_RSI);
  cVar4._M_current = puVar1;
  if (bVar2) {
    cVar4._M_current = (unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)this_01
    ;
  }
LAB_00140db7:
  if (cVar4._M_current ==
      (this->handlers_).
      super__Vector_base<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pIVar6 = (IRHandler *)0x0;
  }
  else {
    pIVar6 = ((cVar4._M_current)->_M_t).
             super___uniq_ptr_impl<flow::IRHandler,_std::default_delete<flow::IRHandler>_>._M_t.
             super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>.
             super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl;
    ((cVar4._M_current)->_M_t).
    super___uniq_ptr_impl<flow::IRHandler,_std::default_delete<flow::IRHandler>_>._M_t.
    super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>.
    super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl = (IRHandler *)0x0;
    std::
    vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
    ::erase(this_00,cVar4);
  }
  std::
  vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
  ::clear(this_00);
  if (pIVar6 != (IRHandler *)0x0) {
    (**(code **)((long)(pIVar6->super_Constant).super_Value._vptr_Value + 8))(pIVar6);
  }
  std::vector<flow::ConstantArray,_std::allocator<flow::ConstantArray>_>::clear
            (&this->constantArrays_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
  ::clear(&this->numbers_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>_>_>
  ::clear(&this->strings_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>,_std::default_delete<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>,_std::default_delete<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_>_>_>_>
  ::clear(&this->ipaddrs_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
  ::clear(&this->cidrs_);
  std::
  vector<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
  ::clear(&this->builtinHandlers_);
  std::
  vector<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
  ::clear(&this->builtinFunctions_);
  std::
  vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
  ::~vector(this_00);
  std::
  vector<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
  ::~vector(&this->builtinHandlers_);
  std::
  vector<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
  ::~vector(&this->builtinFunctions_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
  ::~vector(&this->regexps_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
  ::~vector(&this->cidrs_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>,_std::default_delete<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>,_std::default_delete<flow::ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>_>_>_>_>
  ::~vector(&this->ipaddrs_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>_>_>
  ::~vector(&this->strings_);
  std::
  vector<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
  ::~vector(&this->numbers_);
  std::vector<flow::ConstantArray,_std::allocator<flow::ConstantArray>_>::~vector
            (&this->constantArrays_);
  Value::~Value((Value *)&this->falseLiteral_);
  Value::~Value((Value *)&this->trueLiteral_);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&this->modules_);
  return;
}

Assistant:

IRProgram::~IRProgram() {
  // first reset all standard handlers and *then* the global-scope initialization handler
  // in order to not cause confusion upon resource release
  {
    std::unique_ptr<IRHandler> global;
    auto gh = std::find_if(handlers_.begin(), handlers_.end(), [](auto& handler) {
        return handler->name() == GLOBAL_SCOPE_INIT_NAME;
    });
    if (gh != handlers_.end()) {
      global = std::move(*gh);
      handlers_.erase(gh);
    }
    handlers_.clear();
    global.reset(nullptr);
  }

  constantArrays_.clear();
  numbers_.clear();
  strings_.clear();
  ipaddrs_.clear();
  cidrs_.clear();
  builtinHandlers_.clear();
  builtinFunctions_.clear();
}